

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::SpecparamSymbol::getValue(SpecparamSymbol *this,SourceRange referencingRange)

{
  Token *this_00;
  string_view arg;
  SourceLocation SVar1;
  SyntaxNode *this_01;
  SpecparamDeclaratorSyntax *pSVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Symbol *in_RDI;
  LookupLocation LVar3;
  SourceRange SVar4;
  Expression *expr2;
  ExpressionSyntax *exprSyntax;
  SpecparamDeclaratorSyntax *decl;
  SyntaxNode *syntax;
  Compilation *comp;
  Expression *init;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ParameterSymbols_cpp:473:33)>
  guard;
  Expression *in_stack_00000178;
  ASTContext *in_stack_00000180;
  bitmask<slang::ast::EvalFlags> in_stack_0000018f;
  Diagnostic *diag;
  ASTContext ctx;
  Scope *scope;
  ConstantValue *in_stack_fffffffffffffdd8;
  Compilation *in_stack_fffffffffffffde0;
  ASTContext *in_stack_fffffffffffffde8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffdf0;
  SourceLocation in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  DiagCode in_stack_fffffffffffffe04;
  SourceLocation in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  DiagCode noteCode;
  Diagnostic *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  bitmask<slang::ast::EvalFlags> local_191 [17];
  ASTContext *in_stack_fffffffffffffe80;
  ExpressionSyntax *in_stack_fffffffffffffe88;
  Type *in_stack_fffffffffffffe90;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe98;
  bitmask<slang::ast::EvalFlags> local_129 [41];
  Compilation *local_100;
  Expression *local_e8;
  anon_class_8_1_8991fb9c_for_func local_e0;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ParameterSymbols_cpp:473:33)>
  local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b4;
  size_t local_b0;
  char *local_a8;
  SourceLocation local_a0;
  undefined4 local_94;
  Diagnostic *local_90;
  bitmask<slang::ast::ASTFlags> local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  Scope *local_28;
  undefined8 local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  noteCode = SUB84((ulong)in_stack_fffffffffffffe10 >> 0x20,0);
  if (in_RDI[5].location == (SourceLocation)0x0) {
    local_18 = in_RSI;
    local_10 = in_RDX;
    local_28 = Symbol::getParentScope(in_RDI);
    LVar3 = LookupLocation::before((Symbol *)in_stack_fffffffffffffde0);
    local_80 = LVar3.scope;
    local_78 = LVar3.index;
    local_70 = local_80;
    local_68 = local_78;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_88,SpecparamInitializer);
    LVar3.index = in_stack_fffffffffffffe00;
    LVar3.scope = (Scope *)in_stack_fffffffffffffdf8;
    LVar3._12_2_ = in_stack_fffffffffffffe04.subsystem;
    LVar3._14_2_ = in_stack_fffffffffffffe04.code;
    ASTContext::ASTContext
              (in_stack_fffffffffffffde8,(Scope *)in_stack_fffffffffffffde0,LVar3,
               in_stack_fffffffffffffdf0);
    if (((ulong)in_RDI[5].originatingSyntax & 1) != 0) {
      local_94 = 0x17000c;
      local_a0 = in_RDI->location;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffdf0.m_bits,in_stack_fffffffffffffe04,
                          in_stack_fffffffffffffdf8);
      local_b0 = (in_RDI->name)._M_len;
      local_a8 = (in_RDI->name)._M_str;
      arg._M_str = in_stack_fffffffffffffe30;
      arg._M_len = in_stack_fffffffffffffe28;
      local_90 = Diagnostic::operator<<(in_stack_fffffffffffffe20,arg);
      local_b4 = 0xd0001;
      local_c8 = local_18;
      local_c0 = local_10;
      SVar4.startLoc._4_2_ = in_stack_fffffffffffffe04.subsystem;
      SVar4.startLoc._6_2_ = in_stack_fffffffffffffe04.code;
      SVar4.startLoc._0_4_ = in_stack_fffffffffffffe00;
      SVar4.endLoc = in_stack_fffffffffffffe08;
      Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffdf8,noteCode,SVar4);
      local_8 = slang::ConstantValue::Invalid;
      return (ConstantValue *)local_8;
    }
    *(undefined1 *)&in_RDI[5].originatingSyntax = 1;
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/ParameterSymbols.cpp:473:33)>
    ::ScopeGuard(&local_d8,&local_e0);
    local_e8 = ValueSymbol::getInitializer((ValueSymbol *)0x762d85);
    if (local_e8 == (Expression *)0x0) {
      in_RDI[5].location = (SourceLocation)slang::ConstantValue::Invalid;
      in_RDI[5].parentScope = (Scope *)slang::ConstantValue::Invalid;
    }
    else {
      local_100 = Scope::getCompilation(local_28);
      local_129[0].m_bits = '\0';
      bitmask<slang::ast::EvalFlags>::bitmask(local_129);
      ASTContext::eval(in_stack_00000180,in_stack_00000178,in_stack_0000018f);
      SVar1 = (SourceLocation)
              Compilation::allocConstant(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      in_RDI[5].location = SVar1;
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x762e56);
      this_01 = Symbol::getSyntax(in_RDI);
      pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SpecparamDeclaratorSyntax>(this_01);
      this_00 = (Token *)pSVar2->value2;
      if (this_00 == (Token *)0x0) {
        in_RDI[5].parentScope = (Scope *)slang::ConstantValue::Invalid;
      }
      else {
        ValueSymbol::getType((ValueSymbol *)0x762ecc);
        SVar4 = parsing::Token::range(this_00);
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe98,None);
        Expression::bindRValue
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,SVar4,
                   in_stack_fffffffffffffe80,in_stack_fffffffffffffe98);
        local_191[0].m_bits = '\0';
        bitmask<slang::ast::EvalFlags>::bitmask(local_191);
        ASTContext::eval(in_stack_00000180,in_stack_00000178,in_stack_0000018f);
        in_stack_fffffffffffffde0 =
             (Compilation *)
             Compilation::allocConstant(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        in_RDI[5].parentScope = (Scope *)in_stack_fffffffffffffde0;
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x762ff8);
      }
    }
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/ParameterSymbols.cpp:473:33)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ParameterSymbols_cpp:473:33)>
                   *)in_stack_fffffffffffffde0);
  }
  return (ConstantValue *)in_RDI[5].location;
}

Assistant:

const ConstantValue& SpecparamSymbol::getValue(SourceRange referencingRange) const {
    if (!value1) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        ASTContext ctx(*scope, LookupLocation::before(*this), ASTFlags::SpecparamInitializer);

        if (evaluating) {
            SLANG_ASSERT(referencingRange.start());

            auto& diag = ctx.addDiag(diag::ConstEvalParamCycle, location) << name;
            diag.addNote(diag::NoteReferencedHere, referencingRange);
            return ConstantValue::Invalid;
        }

        evaluating = true;
        auto guard = ScopeGuard([this] { evaluating = false; });

        // If no value has been explicitly set, try to set it
        // from our initializer.
        auto init = getInitializer();
        if (init) {
            auto& comp = scope->getCompilation();
            value1 = comp.allocConstant(ctx.eval(*init));

            // Specparams can also be a "PATHPULSE$" which has two values to bind.
            auto syntax = getSyntax();
            SLANG_ASSERT(syntax);

            auto& decl = syntax->as<SpecparamDeclaratorSyntax>();
            if (auto exprSyntax = decl.value2) {
                auto& expr2 = Expression::bindRValue(getType(), *exprSyntax, decl.equals.range(),
                                                     ctx);
                value2 = comp.allocConstant(ctx.eval(expr2));
            }
            else {
                value2 = &ConstantValue::Invalid;
            }
        }
        else {
            value1 = &ConstantValue::Invalid;
            value2 = &ConstantValue::Invalid;
        }
    }
    return *value1;
}